

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O1

void __thiscall caffe::LayerParameter::LayerParameter(LayerParameter *this,LayerParameter *from)

{
  int iVar1;
  void *pvVar2;
  string *psVar3;
  TransformationParameter *this_00;
  LossParameter *this_01;
  AccuracyParameter *this_02;
  ArgMaxParameter *this_03;
  ConcatParameter *this_04;
  ContrastiveLossParameter *this_05;
  ConvolutionParameter *this_06;
  DataParameter *this_07;
  DropoutParameter *this_08;
  DummyDataParameter *this_09;
  EltwiseParameter *this_10;
  ExpParameter *this_11;
  HDF5DataParameter *this_12;
  HDF5OutputParameter *this_13;
  HingeLossParameter *this_14;
  ImageDataParameter *this_15;
  InfogainLossParameter *this_16;
  InnerProductParameter *this_17;
  LRNParameter *this_18;
  MemoryDataParameter *this_19;
  MVNParameter *this_20;
  PoolingParameter *this_21;
  PowerParameter *this_22;
  ReLUParameter *this_23;
  SigmoidParameter *this_24;
  SoftmaxParameter *this_25;
  SliceParameter *this_26;
  TanHParameter *this_27;
  ThresholdParameter *this_28;
  WindowDataParameter *this_29;
  PythonParameter *this_30;
  PReLUParameter *this_31;
  SPPParameter *this_32;
  ReshapeParameter *this_33;
  LogParameter *this_34;
  FlattenParameter *this_35;
  ReductionParameter *this_36;
  EmbedParameter *this_37;
  TileParameter *this_38;
  BatchNormParameter *this_39;
  ELUParameter *this_40;
  BiasParameter *this_41;
  ScaleParameter *this_42;
  InputParameter *this_43;
  CropParameter *this_44;
  ParameterParameter *this_45;
  RecurrentParameter *this_46;
  
  (this->super_Message).super_MessageLite._vptr_MessageLite =
       (_func_int **)&PTR__LayerParameter_0071ca20;
  (this->_internal_metadata_).
  super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
  .ptr_ = (void *)0x0;
  *(undefined8 *)(this->_has_bits_).has_bits_ = *(undefined8 *)(from->_has_bits_).has_bits_;
  (this->bottom_).super_RepeatedPtrFieldBase.arena_ = (Arena *)0x0;
  (this->bottom_).super_RepeatedPtrFieldBase.current_size_ = 0;
  (this->bottom_).super_RepeatedPtrFieldBase.total_size_ = 0;
  (this->bottom_).super_RepeatedPtrFieldBase.rep_ = (Rep *)0x0;
  google::protobuf::internal::RepeatedPtrFieldBase::
  MergeFrom<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
            (&(this->bottom_).super_RepeatedPtrFieldBase,&(from->bottom_).super_RepeatedPtrFieldBase
            );
  (this->top_).super_RepeatedPtrFieldBase.arena_ = (Arena *)0x0;
  (this->top_).super_RepeatedPtrFieldBase.current_size_ = 0;
  (this->top_).super_RepeatedPtrFieldBase.total_size_ = 0;
  (this->top_).super_RepeatedPtrFieldBase.rep_ = (Rep *)0x0;
  google::protobuf::internal::RepeatedPtrFieldBase::
  MergeFrom<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
            (&(this->top_).super_RepeatedPtrFieldBase,&(from->top_).super_RepeatedPtrFieldBase);
  (this->loss_weight_).current_size_ = 0;
  (this->loss_weight_).total_size_ = 0;
  (this->loss_weight_).rep_ = (Rep *)0x0;
  iVar1 = (from->loss_weight_).current_size_;
  if (iVar1 != 0) {
    google::protobuf::RepeatedField<float>::Reserve(&this->loss_weight_,iVar1);
    memcpy(((this->loss_weight_).rep_)->elements,((from->loss_weight_).rep_)->elements,
           (long)(from->loss_weight_).current_size_ << 2);
    (this->loss_weight_).current_size_ = (from->loss_weight_).current_size_;
  }
  (this->param_).super_RepeatedPtrFieldBase.arena_ = (Arena *)0x0;
  (this->param_).super_RepeatedPtrFieldBase.current_size_ = 0;
  (this->param_).super_RepeatedPtrFieldBase.total_size_ = 0;
  (this->param_).super_RepeatedPtrFieldBase.rep_ = (Rep *)0x0;
  google::protobuf::internal::RepeatedPtrFieldBase::
  MergeFrom<google::protobuf::RepeatedPtrField<caffe::ParamSpec>::TypeHandler>
            (&(this->param_).super_RepeatedPtrFieldBase,&(from->param_).super_RepeatedPtrFieldBase);
  (this->blobs_).super_RepeatedPtrFieldBase.arena_ = (Arena *)0x0;
  (this->blobs_).super_RepeatedPtrFieldBase.current_size_ = 0;
  (this->blobs_).super_RepeatedPtrFieldBase.total_size_ = 0;
  (this->blobs_).super_RepeatedPtrFieldBase.rep_ = (Rep *)0x0;
  google::protobuf::internal::RepeatedPtrFieldBase::
  MergeFrom<google::protobuf::RepeatedPtrField<caffe::BlobProto>::TypeHandler>
            (&(this->blobs_).super_RepeatedPtrFieldBase,&(from->blobs_).super_RepeatedPtrFieldBase);
  (this->include_).super_RepeatedPtrFieldBase.arena_ = (Arena *)0x0;
  (this->include_).super_RepeatedPtrFieldBase.current_size_ = 0;
  (this->include_).super_RepeatedPtrFieldBase.total_size_ = 0;
  (this->include_).super_RepeatedPtrFieldBase.rep_ = (Rep *)0x0;
  google::protobuf::internal::RepeatedPtrFieldBase::
  MergeFrom<google::protobuf::RepeatedPtrField<caffe::NetStateRule>::TypeHandler>
            (&(this->include_).super_RepeatedPtrFieldBase,
             &(from->include_).super_RepeatedPtrFieldBase);
  (this->exclude_).super_RepeatedPtrFieldBase.arena_ = (Arena *)0x0;
  (this->exclude_).super_RepeatedPtrFieldBase.current_size_ = 0;
  (this->exclude_).super_RepeatedPtrFieldBase.total_size_ = 0;
  (this->exclude_).super_RepeatedPtrFieldBase.rep_ = (Rep *)0x0;
  google::protobuf::internal::RepeatedPtrFieldBase::
  MergeFrom<google::protobuf::RepeatedPtrField<caffe::NetStateRule>::TypeHandler>
            (&(this->exclude_).super_RepeatedPtrFieldBase,
             &(from->exclude_).super_RepeatedPtrFieldBase);
  (this->propagate_down_).current_size_ = 0;
  (this->propagate_down_).total_size_ = 0;
  (this->propagate_down_).rep_ = (Rep *)0x0;
  iVar1 = (from->propagate_down_).current_size_;
  if (iVar1 != 0) {
    google::protobuf::RepeatedField<bool>::Reserve(&this->propagate_down_,iVar1);
    memcpy(((this->propagate_down_).rep_)->elements,((from->propagate_down_).rep_)->elements,
           (long)(from->propagate_down_).current_size_);
    (this->propagate_down_).current_size_ = (from->propagate_down_).current_size_;
  }
  this->_cached_size_ = 0;
  pvVar2 = (from->_internal_metadata_).
           super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
           .ptr_;
  if (((ulong)pvVar2 & 1) != 0) {
    google::protobuf::internal::InternalMetadataWithArena::DoMergeFrom
              (&this->_internal_metadata_,(UnknownFieldSet *)((ulong)pvVar2 & 0xfffffffffffffffe));
  }
  (this->name_).ptr_ = (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_;
  if ((((from->_has_bits_).has_bits_[0] & 1) != 0) &&
     (psVar3 = (from->name_).ptr_,
     psVar3 != (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_)) {
    google::protobuf::internal::ArenaStringPtr::CreateInstanceNoArena(&this->name_,psVar3);
  }
  (this->type_).ptr_ = (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_;
  if ((((from->_has_bits_).has_bits_[0] & 2) != 0) &&
     (psVar3 = (from->type_).ptr_,
     psVar3 != (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_)) {
    google::protobuf::internal::ArenaStringPtr::CreateInstanceNoArena(&this->type_,psVar3);
  }
  if (((from->_has_bits_).has_bits_[0] & 4) == 0) {
    this_00 = (TransformationParameter *)0x0;
  }
  else {
    this_00 = (TransformationParameter *)operator_new(0x40);
    TransformationParameter::TransformationParameter(this_00,from->transform_param_);
  }
  this->transform_param_ = this_00;
  if (((from->_has_bits_).has_bits_[0] & 8) == 0) {
    this_01 = (LossParameter *)0x0;
  }
  else {
    this_01 = (LossParameter *)operator_new(0x28);
    LossParameter::LossParameter(this_01,from->loss_param_);
  }
  this->loss_param_ = this_01;
  if (((from->_has_bits_).has_bits_[0] & 0x10) == 0) {
    this_02 = (AccuracyParameter *)0x0;
  }
  else {
    this_02 = (AccuracyParameter *)operator_new(0x28);
    AccuracyParameter::AccuracyParameter(this_02,from->accuracy_param_);
  }
  this->accuracy_param_ = this_02;
  if (((from->_has_bits_).has_bits_[0] & 0x20) == 0) {
    this_03 = (ArgMaxParameter *)0x0;
  }
  else {
    this_03 = (ArgMaxParameter *)operator_new(0x28);
    ArgMaxParameter::ArgMaxParameter(this_03,from->argmax_param_);
  }
  this->argmax_param_ = this_03;
  if (((from->_has_bits_).has_bits_[0] & 0x40) == 0) {
    this_04 = (ConcatParameter *)0x0;
  }
  else {
    this_04 = (ConcatParameter *)operator_new(0x20);
    ConcatParameter::ConcatParameter(this_04,from->concat_param_);
  }
  this->concat_param_ = this_04;
  if (((from->_has_bits_).has_bits_[0] & 0x80) == 0) {
    this_05 = (ContrastiveLossParameter *)0x0;
  }
  else {
    this_05 = (ContrastiveLossParameter *)operator_new(0x20);
    ContrastiveLossParameter::ContrastiveLossParameter(this_05,from->contrastive_loss_param_);
  }
  this->contrastive_loss_param_ = this_05;
  if (((from->_has_bits_).has_bits_[0] & 0x100) == 0) {
    this_06 = (ConvolutionParameter *)0x0;
  }
  else {
    this_06 = (ConvolutionParameter *)operator_new(0x98);
    ConvolutionParameter::ConvolutionParameter(this_06,from->convolution_param_);
  }
  this->convolution_param_ = this_06;
  if (((from->_has_bits_).has_bits_[0] & 0x200) == 0) {
    this_07 = (DataParameter *)0x0;
  }
  else {
    this_07 = (DataParameter *)operator_new(0x48);
    DataParameter::DataParameter(this_07,from->data_param_);
  }
  this->data_param_ = this_07;
  if (((from->_has_bits_).has_bits_[0] & 0x400) == 0) {
    this_08 = (DropoutParameter *)0x0;
  }
  else {
    this_08 = (DropoutParameter *)operator_new(0x20);
    DropoutParameter::DropoutParameter(this_08,from->dropout_param_);
  }
  this->dropout_param_ = this_08;
  if (((from->_has_bits_).has_bits_[0] & 0x800) == 0) {
    this_09 = (DummyDataParameter *)0x0;
  }
  else {
    this_09 = (DummyDataParameter *)operator_new(0x88);
    DummyDataParameter::DummyDataParameter(this_09,from->dummy_data_param_);
  }
  this->dummy_data_param_ = this_09;
  if (((from->_has_bits_).has_bits_[0] & 0x1000) == 0) {
    this_10 = (EltwiseParameter *)0x0;
  }
  else {
    this_10 = (EltwiseParameter *)operator_new(0x30);
    EltwiseParameter::EltwiseParameter(this_10,from->eltwise_param_);
  }
  this->eltwise_param_ = this_10;
  if (((from->_has_bits_).has_bits_[0] & 0x2000) == 0) {
    this_11 = (ExpParameter *)0x0;
  }
  else {
    this_11 = (ExpParameter *)operator_new(0x28);
    ExpParameter::ExpParameter(this_11,from->exp_param_);
  }
  this->exp_param_ = this_11;
  if (((from->_has_bits_).has_bits_[0] & 0x4000) == 0) {
    this_12 = (HDF5DataParameter *)0x0;
  }
  else {
    this_12 = (HDF5DataParameter *)operator_new(0x28);
    HDF5DataParameter::HDF5DataParameter(this_12,from->hdf5_data_param_);
  }
  this->hdf5_data_param_ = this_12;
  if (((from->_has_bits_).has_bits_[0] & 0x8000) == 0) {
    this_13 = (HDF5OutputParameter *)0x0;
  }
  else {
    this_13 = (HDF5OutputParameter *)operator_new(0x20);
    HDF5OutputParameter::HDF5OutputParameter(this_13,from->hdf5_output_param_);
  }
  this->hdf5_output_param_ = this_13;
  if (((from->_has_bits_).has_bits_[0] & 0x10000) == 0) {
    this_14 = (HingeLossParameter *)0x0;
  }
  else {
    this_14 = (HingeLossParameter *)operator_new(0x20);
    HingeLossParameter::HingeLossParameter(this_14,from->hinge_loss_param_);
  }
  this->hinge_loss_param_ = this_14;
  if (((from->_has_bits_).has_bits_[0] & 0x20000) == 0) {
    this_15 = (ImageDataParameter *)0x0;
  }
  else {
    this_15 = (ImageDataParameter *)operator_new(0x50);
    ImageDataParameter::ImageDataParameter(this_15,from->image_data_param_);
  }
  this->image_data_param_ = this_15;
  if (((from->_has_bits_).has_bits_[0] & 0x40000) == 0) {
    this_16 = (InfogainLossParameter *)0x0;
  }
  else {
    this_16 = (InfogainLossParameter *)operator_new(0x20);
    InfogainLossParameter::InfogainLossParameter(this_16,from->infogain_loss_param_);
  }
  this->infogain_loss_param_ = this_16;
  if (((from->_has_bits_).has_bits_[0] & 0x80000) == 0) {
    this_17 = (InnerProductParameter *)0x0;
  }
  else {
    this_17 = (InnerProductParameter *)operator_new(0x38);
    InnerProductParameter::InnerProductParameter(this_17,from->inner_product_param_);
  }
  this->inner_product_param_ = this_17;
  if (((from->_has_bits_).has_bits_[0] & 0x100000) == 0) {
    this_18 = (LRNParameter *)0x0;
  }
  else {
    this_18 = (LRNParameter *)operator_new(0x30);
    LRNParameter::LRNParameter(this_18,from->lrn_param_);
  }
  this->lrn_param_ = this_18;
  if (((from->_has_bits_).has_bits_[0] & 0x200000) == 0) {
    this_19 = (MemoryDataParameter *)0x0;
  }
  else {
    this_19 = (MemoryDataParameter *)operator_new(0x28);
    MemoryDataParameter::MemoryDataParameter(this_19,from->memory_data_param_);
  }
  this->memory_data_param_ = this_19;
  if (((from->_has_bits_).has_bits_[0] & 0x400000) == 0) {
    this_20 = (MVNParameter *)0x0;
  }
  else {
    this_20 = (MVNParameter *)operator_new(0x20);
    MVNParameter::MVNParameter(this_20,from->mvn_param_);
  }
  this->mvn_param_ = this_20;
  if (((from->_has_bits_).has_bits_[0] & 0x800000) == 0) {
    this_21 = (PoolingParameter *)0x0;
  }
  else {
    this_21 = (PoolingParameter *)operator_new(0x48);
    PoolingParameter::PoolingParameter(this_21,from->pooling_param_);
  }
  this->pooling_param_ = this_21;
  if (((from->_has_bits_).has_bits_[0] & 0x1000000) == 0) {
    this_22 = (PowerParameter *)0x0;
  }
  else {
    this_22 = (PowerParameter *)operator_new(0x28);
    PowerParameter::PowerParameter(this_22,from->power_param_);
  }
  this->power_param_ = this_22;
  if (((from->_has_bits_).has_bits_[0] & 0x2000000) == 0) {
    this_23 = (ReLUParameter *)0x0;
  }
  else {
    this_23 = (ReLUParameter *)operator_new(0x20);
    ReLUParameter::ReLUParameter(this_23,from->relu_param_);
  }
  this->relu_param_ = this_23;
  if (((from->_has_bits_).has_bits_[0] & 0x4000000) == 0) {
    this_24 = (SigmoidParameter *)0x0;
  }
  else {
    this_24 = (SigmoidParameter *)operator_new(0x20);
    SigmoidParameter::SigmoidParameter(this_24,from->sigmoid_param_);
  }
  this->sigmoid_param_ = this_24;
  if (((from->_has_bits_).has_bits_[0] & 0x8000000) == 0) {
    this_25 = (SoftmaxParameter *)0x0;
  }
  else {
    this_25 = (SoftmaxParameter *)operator_new(0x20);
    SoftmaxParameter::SoftmaxParameter(this_25,from->softmax_param_);
  }
  this->softmax_param_ = this_25;
  if (((from->_has_bits_).has_bits_[0] & 0x10000000) == 0) {
    this_26 = (SliceParameter *)0x0;
  }
  else {
    this_26 = (SliceParameter *)operator_new(0x30);
    SliceParameter::SliceParameter(this_26,from->slice_param_);
  }
  this->slice_param_ = this_26;
  if (((from->_has_bits_).has_bits_[0] & 0x20000000) == 0) {
    this_27 = (TanHParameter *)0x0;
  }
  else {
    this_27 = (TanHParameter *)operator_new(0x20);
    TanHParameter::TanHParameter(this_27,from->tanh_param_);
  }
  this->tanh_param_ = this_27;
  if (((from->_has_bits_).has_bits_[0] & 0x40000000) == 0) {
    this_28 = (ThresholdParameter *)0x0;
  }
  else {
    this_28 = (ThresholdParameter *)operator_new(0x20);
    ThresholdParameter::ThresholdParameter(this_28,from->threshold_param_);
  }
  this->threshold_param_ = this_28;
  if ((int)(from->_has_bits_).has_bits_[0] < 0) {
    this_29 = (WindowDataParameter *)operator_new(0x58);
    WindowDataParameter::WindowDataParameter(this_29,from->window_data_param_);
  }
  else {
    this_29 = (WindowDataParameter *)0x0;
  }
  this->window_data_param_ = this_29;
  if (((from->_has_bits_).has_bits_[1] & 1) == 0) {
    this_30 = (PythonParameter *)0x0;
  }
  else {
    this_30 = (PythonParameter *)operator_new(0x38);
    PythonParameter::PythonParameter(this_30,from->python_param_);
  }
  this->python_param_ = this_30;
  if (((from->_has_bits_).has_bits_[1] & 2) == 0) {
    this_31 = (PReLUParameter *)0x0;
  }
  else {
    this_31 = (PReLUParameter *)operator_new(0x28);
    PReLUParameter::PReLUParameter(this_31,from->prelu_param_);
  }
  this->prelu_param_ = this_31;
  if (((from->_has_bits_).has_bits_[1] & 4) == 0) {
    this_32 = (SPPParameter *)0x0;
  }
  else {
    this_32 = (SPPParameter *)operator_new(0x28);
    SPPParameter::SPPParameter(this_32,from->spp_param_);
  }
  this->spp_param_ = this_32;
  if (((from->_has_bits_).has_bits_[1] & 8) == 0) {
    this_33 = (ReshapeParameter *)0x0;
  }
  else {
    this_33 = (ReshapeParameter *)operator_new(0x28);
    ReshapeParameter::ReshapeParameter(this_33,from->reshape_param_);
  }
  this->reshape_param_ = this_33;
  if (((from->_has_bits_).has_bits_[1] & 0x10) == 0) {
    this_34 = (LogParameter *)0x0;
  }
  else {
    this_34 = (LogParameter *)operator_new(0x28);
    LogParameter::LogParameter(this_34,from->log_param_);
  }
  this->log_param_ = this_34;
  if (((from->_has_bits_).has_bits_[1] & 0x20) == 0) {
    this_35 = (FlattenParameter *)0x0;
  }
  else {
    this_35 = (FlattenParameter *)operator_new(0x20);
    FlattenParameter::FlattenParameter(this_35,from->flatten_param_);
  }
  this->flatten_param_ = this_35;
  if (((from->_has_bits_).has_bits_[1] & 0x40) == 0) {
    this_36 = (ReductionParameter *)0x0;
  }
  else {
    this_36 = (ReductionParameter *)operator_new(0x28);
    ReductionParameter::ReductionParameter(this_36,from->reduction_param_);
  }
  this->reduction_param_ = this_36;
  if (((from->_has_bits_).has_bits_[1] & 0x80) == 0) {
    this_37 = (EmbedParameter *)0x0;
  }
  else {
    this_37 = (EmbedParameter *)operator_new(0x38);
    EmbedParameter::EmbedParameter(this_37,from->embed_param_);
  }
  this->embed_param_ = this_37;
  if ((*(byte *)((long)(from->_has_bits_).has_bits_ + 5) & 1) == 0) {
    this_38 = (TileParameter *)0x0;
  }
  else {
    this_38 = (TileParameter *)operator_new(0x20);
    TileParameter::TileParameter(this_38,from->tile_param_);
  }
  this->tile_param_ = this_38;
  if ((*(byte *)((long)(from->_has_bits_).has_bits_ + 5) & 2) == 0) {
    this_39 = (BatchNormParameter *)0x0;
  }
  else {
    this_39 = (BatchNormParameter *)operator_new(0x28);
    BatchNormParameter::BatchNormParameter(this_39,from->batch_norm_param_);
  }
  this->batch_norm_param_ = this_39;
  if ((*(byte *)((long)(from->_has_bits_).has_bits_ + 5) & 4) == 0) {
    this_40 = (ELUParameter *)0x0;
  }
  else {
    this_40 = (ELUParameter *)operator_new(0x20);
    ELUParameter::ELUParameter(this_40,from->elu_param_);
  }
  this->elu_param_ = this_40;
  if ((*(byte *)((long)(from->_has_bits_).has_bits_ + 5) & 8) == 0) {
    this_41 = (BiasParameter *)0x0;
  }
  else {
    this_41 = (BiasParameter *)operator_new(0x28);
    BiasParameter::BiasParameter(this_41,from->bias_param_);
  }
  this->bias_param_ = this_41;
  if ((*(byte *)((long)(from->_has_bits_).has_bits_ + 5) & 0x10) == 0) {
    this_42 = (ScaleParameter *)0x0;
  }
  else {
    this_42 = (ScaleParameter *)operator_new(0x38);
    ScaleParameter::ScaleParameter(this_42,from->scale_param_);
  }
  this->scale_param_ = this_42;
  if ((*(byte *)((long)(from->_has_bits_).has_bits_ + 5) & 0x20) == 0) {
    this_43 = (InputParameter *)0x0;
  }
  else {
    this_43 = (InputParameter *)operator_new(0x30);
    InputParameter::InputParameter(this_43,from->input_param_);
  }
  this->input_param_ = this_43;
  if ((*(byte *)((long)(from->_has_bits_).has_bits_ + 5) & 0x40) == 0) {
    this_44 = (CropParameter *)0x0;
  }
  else {
    this_44 = (CropParameter *)operator_new(0x30);
    CropParameter::CropParameter(this_44,from->crop_param_);
  }
  this->crop_param_ = this_44;
  if ((*(byte *)((long)(from->_has_bits_).has_bits_ + 5) & 0x80) == 0) {
    this_45 = (ParameterParameter *)0x0;
  }
  else {
    this_45 = (ParameterParameter *)operator_new(0x20);
    ParameterParameter::ParameterParameter(this_45,from->parameter_param_);
  }
  this->parameter_param_ = this_45;
  if ((*(byte *)((long)(from->_has_bits_).has_bits_ + 6) & 1) == 0) {
    this_46 = (RecurrentParameter *)0x0;
  }
  else {
    this_46 = (RecurrentParameter *)operator_new(0x30);
    RecurrentParameter::RecurrentParameter(this_46,from->recurrent_param_);
  }
  this->recurrent_param_ = this_46;
  this->phase_ = from->phase_;
  return;
}

Assistant:

LayerParameter::LayerParameter(const LayerParameter& from)
  : ::google::protobuf::Message(),
      _internal_metadata_(NULL),
      _has_bits_(from._has_bits_),
      bottom_(from.bottom_),
      top_(from.top_),
      loss_weight_(from.loss_weight_),
      param_(from.param_),
      blobs_(from.blobs_),
      include_(from.include_),
      exclude_(from.exclude_),
      propagate_down_(from.propagate_down_),
      _cached_size_(0) {
  _internal_metadata_.MergeFrom(from._internal_metadata_);
  name_.UnsafeSetDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited());
  if (from.has_name()) {
    name_.AssignWithDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited(), from.name_);
  }
  type_.UnsafeSetDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited());
  if (from.has_type()) {
    type_.AssignWithDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited(), from.type_);
  }
  if (from.has_transform_param()) {
    transform_param_ = new ::caffe::TransformationParameter(*from.transform_param_);
  } else {
    transform_param_ = NULL;
  }
  if (from.has_loss_param()) {
    loss_param_ = new ::caffe::LossParameter(*from.loss_param_);
  } else {
    loss_param_ = NULL;
  }
  if (from.has_accuracy_param()) {
    accuracy_param_ = new ::caffe::AccuracyParameter(*from.accuracy_param_);
  } else {
    accuracy_param_ = NULL;
  }
  if (from.has_argmax_param()) {
    argmax_param_ = new ::caffe::ArgMaxParameter(*from.argmax_param_);
  } else {
    argmax_param_ = NULL;
  }
  if (from.has_concat_param()) {
    concat_param_ = new ::caffe::ConcatParameter(*from.concat_param_);
  } else {
    concat_param_ = NULL;
  }
  if (from.has_contrastive_loss_param()) {
    contrastive_loss_param_ = new ::caffe::ContrastiveLossParameter(*from.contrastive_loss_param_);
  } else {
    contrastive_loss_param_ = NULL;
  }
  if (from.has_convolution_param()) {
    convolution_param_ = new ::caffe::ConvolutionParameter(*from.convolution_param_);
  } else {
    convolution_param_ = NULL;
  }
  if (from.has_data_param()) {
    data_param_ = new ::caffe::DataParameter(*from.data_param_);
  } else {
    data_param_ = NULL;
  }
  if (from.has_dropout_param()) {
    dropout_param_ = new ::caffe::DropoutParameter(*from.dropout_param_);
  } else {
    dropout_param_ = NULL;
  }
  if (from.has_dummy_data_param()) {
    dummy_data_param_ = new ::caffe::DummyDataParameter(*from.dummy_data_param_);
  } else {
    dummy_data_param_ = NULL;
  }
  if (from.has_eltwise_param()) {
    eltwise_param_ = new ::caffe::EltwiseParameter(*from.eltwise_param_);
  } else {
    eltwise_param_ = NULL;
  }
  if (from.has_exp_param()) {
    exp_param_ = new ::caffe::ExpParameter(*from.exp_param_);
  } else {
    exp_param_ = NULL;
  }
  if (from.has_hdf5_data_param()) {
    hdf5_data_param_ = new ::caffe::HDF5DataParameter(*from.hdf5_data_param_);
  } else {
    hdf5_data_param_ = NULL;
  }
  if (from.has_hdf5_output_param()) {
    hdf5_output_param_ = new ::caffe::HDF5OutputParameter(*from.hdf5_output_param_);
  } else {
    hdf5_output_param_ = NULL;
  }
  if (from.has_hinge_loss_param()) {
    hinge_loss_param_ = new ::caffe::HingeLossParameter(*from.hinge_loss_param_);
  } else {
    hinge_loss_param_ = NULL;
  }
  if (from.has_image_data_param()) {
    image_data_param_ = new ::caffe::ImageDataParameter(*from.image_data_param_);
  } else {
    image_data_param_ = NULL;
  }
  if (from.has_infogain_loss_param()) {
    infogain_loss_param_ = new ::caffe::InfogainLossParameter(*from.infogain_loss_param_);
  } else {
    infogain_loss_param_ = NULL;
  }
  if (from.has_inner_product_param()) {
    inner_product_param_ = new ::caffe::InnerProductParameter(*from.inner_product_param_);
  } else {
    inner_product_param_ = NULL;
  }
  if (from.has_lrn_param()) {
    lrn_param_ = new ::caffe::LRNParameter(*from.lrn_param_);
  } else {
    lrn_param_ = NULL;
  }
  if (from.has_memory_data_param()) {
    memory_data_param_ = new ::caffe::MemoryDataParameter(*from.memory_data_param_);
  } else {
    memory_data_param_ = NULL;
  }
  if (from.has_mvn_param()) {
    mvn_param_ = new ::caffe::MVNParameter(*from.mvn_param_);
  } else {
    mvn_param_ = NULL;
  }
  if (from.has_pooling_param()) {
    pooling_param_ = new ::caffe::PoolingParameter(*from.pooling_param_);
  } else {
    pooling_param_ = NULL;
  }
  if (from.has_power_param()) {
    power_param_ = new ::caffe::PowerParameter(*from.power_param_);
  } else {
    power_param_ = NULL;
  }
  if (from.has_relu_param()) {
    relu_param_ = new ::caffe::ReLUParameter(*from.relu_param_);
  } else {
    relu_param_ = NULL;
  }
  if (from.has_sigmoid_param()) {
    sigmoid_param_ = new ::caffe::SigmoidParameter(*from.sigmoid_param_);
  } else {
    sigmoid_param_ = NULL;
  }
  if (from.has_softmax_param()) {
    softmax_param_ = new ::caffe::SoftmaxParameter(*from.softmax_param_);
  } else {
    softmax_param_ = NULL;
  }
  if (from.has_slice_param()) {
    slice_param_ = new ::caffe::SliceParameter(*from.slice_param_);
  } else {
    slice_param_ = NULL;
  }
  if (from.has_tanh_param()) {
    tanh_param_ = new ::caffe::TanHParameter(*from.tanh_param_);
  } else {
    tanh_param_ = NULL;
  }
  if (from.has_threshold_param()) {
    threshold_param_ = new ::caffe::ThresholdParameter(*from.threshold_param_);
  } else {
    threshold_param_ = NULL;
  }
  if (from.has_window_data_param()) {
    window_data_param_ = new ::caffe::WindowDataParameter(*from.window_data_param_);
  } else {
    window_data_param_ = NULL;
  }
  if (from.has_python_param()) {
    python_param_ = new ::caffe::PythonParameter(*from.python_param_);
  } else {
    python_param_ = NULL;
  }
  if (from.has_prelu_param()) {
    prelu_param_ = new ::caffe::PReLUParameter(*from.prelu_param_);
  } else {
    prelu_param_ = NULL;
  }
  if (from.has_spp_param()) {
    spp_param_ = new ::caffe::SPPParameter(*from.spp_param_);
  } else {
    spp_param_ = NULL;
  }
  if (from.has_reshape_param()) {
    reshape_param_ = new ::caffe::ReshapeParameter(*from.reshape_param_);
  } else {
    reshape_param_ = NULL;
  }
  if (from.has_log_param()) {
    log_param_ = new ::caffe::LogParameter(*from.log_param_);
  } else {
    log_param_ = NULL;
  }
  if (from.has_flatten_param()) {
    flatten_param_ = new ::caffe::FlattenParameter(*from.flatten_param_);
  } else {
    flatten_param_ = NULL;
  }
  if (from.has_reduction_param()) {
    reduction_param_ = new ::caffe::ReductionParameter(*from.reduction_param_);
  } else {
    reduction_param_ = NULL;
  }
  if (from.has_embed_param()) {
    embed_param_ = new ::caffe::EmbedParameter(*from.embed_param_);
  } else {
    embed_param_ = NULL;
  }
  if (from.has_tile_param()) {
    tile_param_ = new ::caffe::TileParameter(*from.tile_param_);
  } else {
    tile_param_ = NULL;
  }
  if (from.has_batch_norm_param()) {
    batch_norm_param_ = new ::caffe::BatchNormParameter(*from.batch_norm_param_);
  } else {
    batch_norm_param_ = NULL;
  }
  if (from.has_elu_param()) {
    elu_param_ = new ::caffe::ELUParameter(*from.elu_param_);
  } else {
    elu_param_ = NULL;
  }
  if (from.has_bias_param()) {
    bias_param_ = new ::caffe::BiasParameter(*from.bias_param_);
  } else {
    bias_param_ = NULL;
  }
  if (from.has_scale_param()) {
    scale_param_ = new ::caffe::ScaleParameter(*from.scale_param_);
  } else {
    scale_param_ = NULL;
  }
  if (from.has_input_param()) {
    input_param_ = new ::caffe::InputParameter(*from.input_param_);
  } else {
    input_param_ = NULL;
  }
  if (from.has_crop_param()) {
    crop_param_ = new ::caffe::CropParameter(*from.crop_param_);
  } else {
    crop_param_ = NULL;
  }
  if (from.has_parameter_param()) {
    parameter_param_ = new ::caffe::ParameterParameter(*from.parameter_param_);
  } else {
    parameter_param_ = NULL;
  }
  if (from.has_recurrent_param()) {
    recurrent_param_ = new ::caffe::RecurrentParameter(*from.recurrent_param_);
  } else {
    recurrent_param_ = NULL;
  }
  phase_ = from.phase_;
  // @@protoc_insertion_point(copy_constructor:caffe.LayerParameter)
}